

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

bool __thiscall mpt::object::set(object *this,char *name,value *val,logger *out)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  property pr;
  
  pcVar3 = value::string(val);
  if (pcVar3 == (char *)0x0) {
    iVar1 = mpt_object_set_value(this,name,val);
  }
  else {
    iVar1 = mpt_object_set_string(this,name,pcVar3,0);
  }
  if (out == (logger *)0x0 || -1 < iVar1) goto LAB_001316c0;
  property::property(&pr,"",(char *)0x0);
  iVar2 = (**this->_vptr_object)(this,&pr);
  if (iVar2 < 0) {
    pr.name = "object";
  }
  if (iVar1 == -3) {
    pcVar4 = "bad property type";
LAB_0013162c:
    if (pcVar3 == (char *)0x0) {
      if (name == (char *)0x0) {
        pcVar3 = "%s: %s = <%s>";
      }
      else {
        pcVar3 = "%s: %s.%s = <%d>";
      }
    }
    else if (name == (char *)0x0) {
      pcVar3 = "%s: %s = \"%s\"";
    }
    else {
      pcVar3 = "%s: %s.%s = \"%s\"";
    }
  }
  else {
    if (iVar1 == -2) {
      pcVar4 = "bad property value";
      goto LAB_0013162c;
    }
    if (iVar1 != -1) goto LAB_001316c0;
    if (name == (char *)0x0) {
      pcVar3 = "%s: %s";
    }
    else {
      pcVar3 = "%s: %s.%s";
    }
    pcVar4 = "bad property";
  }
  logger::message(out,"mpt::object::set",3,pcVar3,pcVar4,pr.name);
LAB_001316c0:
  return -1 < iVar1;
}

Assistant:

bool object::set(const char *name, const value &val, logger *out)
{
	static const char _fname[] = "mpt::object::set";
	const char *str;
	int ret;
	if (!(str = val.string())) {
		ret = mpt_object_set_value(this, name, &val);
	} else {
		ret = mpt_object_set_string(this, name, str, 0);
	}
	if (ret >= 0) {
		return true;
	}
	if (!out) {
		return false;
	}
	::mpt::property pr("");
	if (property(&pr) < 0) {
		pr.name = "object";
	}
	
	const char *err;
	if (ret == BadArgument) {
		err = MPT_tr("bad property");
		if (name) {
			out->message(_fname, out->Error, "%s: %s.%s", err, pr.name, name);
		} else {
			out->message(_fname, out->Error, "%s: %s", err, pr.name);
		}
		return false;
	}
	err = 0;
	if (ret == BadValue) {
		err = MPT_tr("bad property value");
	}
	else if (ret == BadType) {
		err = MPT_tr("bad property type");
	}
	
	if (err) {
		if (str) {
			if (name) {
				out->message(_fname, out->Error, "%s: %s.%s = \"%s\"", err, pr.name, name, str);
			} else {
				out->message(_fname, out->Error, "%s: %s = \"%s\"", err, pr.name, str);
			}
		}
		else {
			const int type = val.type();
			if (name) {
				out->message(_fname, out->Error, "%s: %s.%s = <%d>", err, pr.name, name, type);
			} else {
				out->message(_fname, out->Error, "%s: %s = <%s>", err, pr.name, type);
			}
		}
	}
	return false;
}